

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O2

void __thiscall lsim::Simulator::clear_components(Simulator *this)

{
  pointer ppSVar1;
  
  std::
  vector<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
  ::clear(&this->m_components);
  ppSVar1 = (this->m_init_components).
            super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_init_components).
      super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar1) {
    (this->m_init_components).
    super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar1;
  }
  ppSVar1 = (this->m_independent_components).
            super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_independent_components).
      super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar1) {
    (this->m_independent_components).
    super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar1;
  }
  clear_pins(this);
  clear_nodes(this);
  return;
}

Assistant:

void Simulator::clear_components() {
    m_components.clear();
    m_init_components.clear();
    m_independent_components.clear();
    clear_pins();
    clear_nodes();
}